

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

bool __thiscall LinearSystem::RunDirectGauss(LinearSystem *this,ChoiceType choice_type)

{
  ExtendedMatrix *this_00;
  bool bVar1;
  Fraction *pFVar2;
  Fraction FVar3;
  Fraction *b;
  int iVar4;
  int row;
  int iVar5;
  int pos;
  int local_3c;
  Fraction coefficient;
  
  this->rank_ = 0;
  iVar4 = this->n_;
  if (this->m_ < this->n_) {
    iVar4 = this->m_;
  }
  this_00 = &this->system_;
  pos = 0;
  if (iVar4 < 1) {
    iVar4 = pos;
  }
  iVar5 = 1;
  do {
    if (pos == iVar4) {
      this->rank_ = this->n_;
      return this->n_ != 0;
    }
    bVar1 = Choice(this,pos,choice_type);
    if (bVar1) {
LAB_0010ac17:
      this->rank_ = this->rank_ + 1;
      local_3c = 1;
      pFVar2 = ExtendedMatrix::At(this_00,pos,pos);
      FVar3 = operator/(&local_3c,pFVar2);
      PerformOperation(this,MultiplyRow,pos,0,FVar3);
      AddMainOutput(this);
      for (row = iVar5; row < this->n_; row = row + 1) {
        pFVar2 = ExtendedMatrix::At(this_00,row,pos);
        b = ExtendedMatrix::At(this_00,pos,pos);
        coefficient = operator/(pFVar2,b);
        FVar3 = Fraction::operator-(&coefficient);
        PerformOperation(this,AddRow,row,pos,FVar3);
      }
      AddMainOutput(this);
    }
    else {
      bVar1 = Choice(this,pos,Column);
      if (bVar1) goto LAB_0010ac17;
    }
    pos = pos + 1;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

bool LinearSystem::RunDirectGauss(Options::ChoiceType choice_type) {
  rank_ = 0;

  int max_pos = std::min(n_, m_);
  for (int pos = 0; pos < max_pos; ++pos) {
    if (!Choice(pos, choice_type) && !Choice(pos)) {
      continue;
    }

    ++rank_;

    PerformOperation(OperationType::MultiplyRow, pos, 0, 1 / system_.At(pos, pos));
    AddMainOutput();

    for (int row = pos + 1; row < n_; ++row) {
      Fraction coefficient = system_.At(row, pos) / system_.At(pos, pos);
      PerformOperation(OperationType::AddRow, row, pos, -coefficient);
    }

    AddMainOutput();
  }

  return rank_ = n_;
}